

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.c
# Opt level: O2

void * load_image_fn(sexp ctx,sexp dl,sexp name)

{
  char *pcVar1;
  sexp psVar2;
  sexp psVar3;
  sexp_proc2 p_Var4;
  long lVar5;
  int iVar6;
  sexp psVar7;
  size_t __n;
  void *pvVar8;
  long lVar9;
  sexp_proc2 *pp_Var10;
  char *__s1;
  char *pcVar11;
  
  lVar9 = (long)&((name->value).type.cpl)->value + (long)&((name->value).type.name)->value;
  if ((((ulong)dl & 3) == 0 && dl != (sexp)0x0) && (dl->tag == 0x1a)) {
    psVar7 = (dl->value).type.cpl;
    if (psVar7 == (sexp)0x0) {
      psVar7 = (dl->value).type.name;
      psVar2 = (psVar7->value).type.name;
      psVar3 = (psVar7->value).type.cpl;
      __s1 = (psVar2->value).flonum_bits + (long)(psVar3->value).flonum_bits;
      psVar7 = (sexp)dlopen(__s1,1);
      (dl->value).type.cpl = psVar7;
      if (psVar7 == (sexp)0x0) {
        pp_Var10 = &(((ctx->value).type.setters)->value).type.finalize;
        while ((p_Var4 = *pp_Var10, ((ulong)p_Var4 & 3) == 0 && (*(int *)p_Var4 == 6))) {
          lVar5 = *(long *)(p_Var4 + 8);
          pcVar11 = (char *)(*(long *)(lVar5 + 8) + *(long *)(lVar5 + 0x10) + 0x10);
          __n = strlen(pcVar11);
          iVar6 = strncmp(__s1,pcVar11,__n);
          if (iVar6 == 0) {
            pcVar11 = (psVar2->value).flonum_bits +
                      (long)(&psVar3->field_0x7 + *(long *)(lVar5 + 0x18));
            do {
              pcVar1 = pcVar11 + 1;
              pcVar11 = pcVar11 + 1;
            } while (*pcVar1 == '/');
            pcVar11 = sexp_find_module_file_raw(ctx,pcVar11);
            if (pcVar11 != (char *)0x0) {
              psVar7 = (sexp)dlopen(pcVar11,1);
              (dl->value).type.cpl = psVar7;
              free(pcVar11);
              psVar7 = (dl->value).type.cpl;
              if (psVar7 != (sexp)0x0) goto LAB_0011d9cc;
            }
          }
          pp_Var10 = (sexp_proc2 *)(p_Var4 + 0x10);
        }
        psVar7 = (dl->value).type.cpl;
        if (psVar7 == (sexp)0x0) {
          psVar7 = (dl->value).type.name;
          snprintf(gc_heap_err_str,0x100,"dlopen failure: %s",
                   (long)&((psVar7->value).type.cpl)->value +
                   (long)&((psVar7->value).type.name)->value);
          return (void *)0x0;
        }
      }
    }
  }
  else {
    psVar7 = (sexp)0x0;
  }
LAB_0011d9cc:
  pvVar8 = (void *)dlsym(psVar7,lVar9);
  if (pvVar8 == (void *)0x0) {
    pvVar8 = (void *)0x0;
    snprintf(gc_heap_err_str,0x100,"dynamic function lookup failure: %s %s","<static>",lVar9);
  }
  return pvVar8;
}

Assistant:

static void* load_image_fn(sexp ctx, sexp dl, sexp name) {
  sexp ls;
  void *fn = NULL;
  char *file_name, *rel_name=NULL, *new_file_name;
  char *handle_name = "<static>";
  char *symbol_name = sexp_string_data(name);
  if (dl && sexp_dlp(dl)) {
    if (!sexp_dl_handle(dl)) {
      /* try exact file, then the search path */
      file_name = sexp_string_data(sexp_dl_file(dl));
      sexp_dl_handle(dl) = dlopen(file_name, RTLD_LAZY);
      if (!sexp_dl_handle(dl)) {
        for (ls = sexp_global(ctx, SEXP_G_MODULE_PATH); sexp_pairp(ls); ls=sexp_cdr(ls)) {
          if (strstr(file_name, sexp_string_data(sexp_car(ls))) == file_name) {
            rel_name = file_name + sexp_string_size(sexp_car(ls));
            while (*rel_name == '/')
              ++rel_name;
            new_file_name = sexp_find_module_file_raw(ctx, rel_name);
            if (new_file_name) {
              sexp_dl_handle(dl) = dlopen(new_file_name, RTLD_LAZY);
              free(new_file_name);
              if (sexp_dl_handle(dl))
                break;
            }
          }
        }
        if (!sexp_dl_handle(dl)) {
          handle_name = sexp_string_data(sexp_dl_file(dl));
          snprintf(gc_heap_err_str, ERR_STR_SIZE, "dlopen failure: %s",
                   handle_name);
          return NULL;
        }
      }
    }
    fn = dlsym(sexp_dl_handle(dl), symbol_name);
  } else {
    fn = dlsym(SEXP_RTLD_DEFAULT, symbol_name);
  }
  if (!fn) {
    snprintf(gc_heap_err_str, ERR_STR_SIZE,
             "dynamic function lookup failure: %s %s",
             handle_name, symbol_name);
  }
  return fn;
}